

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab8-0.c
# Opt level: O2

TTestcaseData GetFromTestcase(uint testcaseIdx,ETestcaseDataId dataId,uint edgeIdx)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  TTestcaseData TVar1;
  
  if (testcaseIdx < 0x1e) {
    TVar1 = (TTestcaseData)
            (*(code *)(&DAT_00103054 + *(int *)(&DAT_00103054 + (ulong)dataId * 4)))();
    return TVar1;
  }
  if (testcaseIdx == 0x1e) {
    TVar1 = (TTestcaseData)
            (*(code *)(&DAT_00103040 + *(int *)(&DAT_00103040 + (ulong)dataId * 4)))();
    return TVar1;
  }
  if (testcaseIdx - 0x1f < 2) {
    TVar1 = (TTestcaseData)
            (*(code *)(&DAT_0010302c + *(int *)(&DAT_0010302c + (ulong)dataId * 4)))();
    return TVar1;
  }
  if (testcaseIdx == 0x21) {
    TVar1 = (TTestcaseData)
            (*(code *)(&DAT_00103018 + *(int *)(&DAT_00103018 + (ulong)dataId * 4)))
                      (0x21,CONCAT44(in_register_00000034,dataId),
                       CONCAT44(in_register_00000014,edgeIdx));
    return TVar1;
  }
  abort();
}

Assistant:

static TTestcaseData GetFromTestcase(unsigned testcaseIdx, enum ETestcaseDataId dataId, unsigned edgeIdx) {
    const unsigned smallTestCount = 30;
    if (testcaseIdx < smallTestCount) {
        typedef struct TSmallTest {
            unsigned VertexCount;
            unsigned EdgeCount;
            struct TEdge Edges[8];
            const char* Message;
            unsigned long long MstLength;
        } TSmallTest;

        static const TSmallTest smallTests[] = {
            {3, 3, {{1, 2, 10}, {2, 3, 5}, {3, 1, 5}}, NULL, 10},
            {3, 1, {{1, 2, 10}}, "no spanning tree"},
            {2, 1, {{IGNORED_VERTEX_IDX}}, "bad number of lines"},

            {0, 0, {{IGNORED_VERTEX_IDX}}, "no spanning tree"},
            {MAX_VERTEX_COUNT+1, 1, {{1, 1, 1}}, "bad number of vertices"},
            {2, 4, {{1, 1, 1}, {1, 2, 1}, {2, 1, 1}, {2, 2, 1}}, "bad number of edges"},
            {2, 2, {{1, 2, 2}, {1, 2, 1}}, "bad number of edges"},
            {2, 1, {{1, 2, (unsigned long long)-1}}, "bad length"},

            {2, 0, {{IGNORED_VERTEX_IDX}}, "no spanning tree"},
            {2, 1, {{1, 2, (unsigned long long)4*INT_MAX}}, "bad length"},
            {4, 2, {{1, 2, INT_MAX}, {2, 3, INT_MAX}}, "no spanning tree"},
            {2, 1, {{1, 1, INT_MAX}}, "no spanning tree"},

            {1, 0, {{IGNORED_VERTEX_IDX}}, NULL, 0},
            {4, 4, {{1, 2, 1}, {2, 3, 2}, {3, 4, 4}, {4, 1, 8}}, NULL, 7},
            {3, 2, {{1, 2, INT_MAX}, {2, 3, INT_MAX}}, NULL, 2ull * INT_MAX},
            {3, 3, {{1, 2, INT_MAX}, {2, 3, INT_MAX}, {1, 3, 1}}, NULL, 1ull + INT_MAX},

            {4, 4, {{1, 2, INT_MAX}, {2, 3, INT_MAX}, {3, 4, INT_MAX}, {4, 1, INT_MAX}}, NULL, 3ull * INT_MAX},
            {4, 4, {{1, 2, 1u << 28}, {2, 3, 2u << 28}, {3, 4, 3u << 28}, {4, 1, 4u << 28}}, NULL, 6ull << 28},
            {4, 4, {{1, 2, (1u << 28) + 4}, {2, 3, (2u << 28) + 3}, {3, 4, (3u << 28) + 2}, {4, 1, (4u << 28) + 1}}, NULL, (6ull << 28) + 9},
            {4, 4, {{1, 2, 1}, {2, 3, 1}, {3, 4, 1}, {4, 1, 1}}, NULL, 3},
            {5, 4, {{1, 2, 1}, {2, 3, 1}, {3, 1, 1}, {4, 3, 1}}, "no spanning tree"},
            {4, 6, {{1, 2, 1}, {1, 3, 2}, {1, 4, 4}, {2, 3, 8}, {2, 4, 16}, {3, 4, 32}}, NULL, 7},

            {3, 2, {{1, 2, 1}, {2, 4, 1}}, "bad vertex"},
            {3, 2, {{1, 2, 1}, {4, 2, 1}}, "bad vertex"},
            {3, 2, {{1, 2, 1}, {(unsigned)-1, 2, 1}}, "bad vertex"},
            {3, 2, {{1, 2, 1}, {2, (unsigned)-1, 1}}, "bad vertex"},

            {4, 4, {{1, 2, 1}, {2, 3, 2}, {1, 3, 3}, {4, 3, 4}}, NULL, 7},
            {4, 3, {{1, 2, 1}, {3, 4, 2}, {2, 4, 3}}, NULL, 6},
            {6, 6, {{1, 2, 1}, {2, 3, 2}, {4, 5, 3}, {5, 6, 4}, {3, 4, 5}, {1, 6, 6}}, NULL, 15},

            {6, 6, {{1, 2, 1}, {3, 4, 2}, {5, 6, 3}, {2, 3, 4}, {4, 5, 5}, {1, 6, 6}}, NULL, 15},
        };
        if (smallTestCount != sizeof(smallTests) / sizeof(smallTests[0])) {
            abort();
        }
        const TSmallTest* test = &smallTests[testcaseIdx];
        switch (dataId) {
            case VERTEX_COUNT:
                return MakeInteger(test->VertexCount);
            case EDGE_COUNT:
                return MakeInteger(test->EdgeCount);
            case EDGE:
                assert(edgeIdx < test->EdgeCount);
                return MakeEdge(test->Edges[edgeIdx].Begin, test->Edges[edgeIdx].End, test->Edges[edgeIdx].Length);
            case ERROR_MESSAGE:
                return MakeString(test->Message);
            case MST_LENGTH:
                return MakeInteger(test->MstLength);
            default:
                abort();
        }
    } else if (testcaseIdx == smallTestCount) {
        switch (dataId) {
            case VERTEX_COUNT:
            case EDGE_COUNT:
                return MakeInteger(MAX_VERTEX_COUNT);
            case EDGE:
                assert(edgeIdx < MAX_VERTEX_COUNT);
                return MakeEdge(edgeIdx + 1, (edgeIdx + 1) % MAX_VERTEX_COUNT + 1, edgeIdx + 1);
            case ERROR_MESSAGE:
                return MakeString(NULL);
            case MST_LENGTH:
                return MakeInteger(SumRange(1, MAX_VERTEX_COUNT - 1));
            default:
                abort();
        }
    } else if (testcaseIdx == smallTestCount + 1 || testcaseIdx == smallTestCount + 2) {
        const unsigned partOneEdgeCount = MAX_VERTEX_COUNT - 2;
        const unsigned partTwoEdgeCount = MAX_VERTEX_COUNT - 3;
        const int slope = testcaseIdx == 28 ? 1 : -1;
        const int bias = testcaseIdx == 28 ? 0 : MAX_VERTEX_COUNT + 1;
        switch (dataId) {
            case VERTEX_COUNT:
                return MakeInteger(MAX_VERTEX_COUNT);
            case EDGE_COUNT:
                return MakeInteger(partOneEdgeCount + partTwoEdgeCount + 1);
            case EDGE:
                assert(edgeIdx < partOneEdgeCount + partTwoEdgeCount + 1);
                if (edgeIdx < partOneEdgeCount) {
                    return MakeEdge((edgeIdx + 1) * slope + bias, (edgeIdx + 2) * slope + bias, edgeIdx + 1);
                } else if (edgeIdx < partOneEdgeCount + partTwoEdgeCount) {
                    return MakeEdge(1 * slope + bias, (edgeIdx - partOneEdgeCount + 3) * slope + bias, edgeIdx + 3);
                } else {
                    return MakeEdge((MAX_VERTEX_COUNT - 1) * slope + bias, MAX_VERTEX_COUNT * slope + bias, 2 * MAX_VERTEX_COUNT - 2);
                }
            case ERROR_MESSAGE:
                return MakeString(NULL);
            case MST_LENGTH:
                return MakeInteger(SumRange(1, MAX_VERTEX_COUNT - 2) + 2 * MAX_VERTEX_COUNT - 2);
            default:
                abort();
        }
    } else if (testcaseIdx == smallTestCount + 3) {
        const unsigned partOneEdgeCount = MAX_VERTEX_COUNT - 2;
        const unsigned partTwoEdgeCount = SumRange(MAX_VERTEX_COUNT * 4 / 5, MAX_VERTEX_COUNT - 3);
        switch (dataId) {
            case VERTEX_COUNT:
                return MakeInteger(MAX_VERTEX_COUNT);
            case EDGE_COUNT:
                return MakeInteger(partOneEdgeCount + partTwoEdgeCount + 1);
            case EDGE:
                assert(edgeIdx < partOneEdgeCount + partTwoEdgeCount + 1);
                if (edgeIdx < partOneEdgeCount) {
                    return MakeEdge(edgeIdx + 1, edgeIdx + 2, edgeIdx + 1);
                } else if (edgeIdx < partOneEdgeCount + partTwoEdgeCount) {
                    unsigned row, column;
                    CalcRowColumn(edgeIdx - partOneEdgeCount + SumRange(0, MAX_VERTEX_COUNT * 4 / 5 - 1), &row, &column); // row = N * 4 / 5 ... N - 3, column = 0 ... row
                    row = MAX_VERTEX_COUNT - row;
                    return MakeEdge(row - 3, column + row, MAX_VERTEX_COUNT - 1);
                } else {
                    return MakeEdge(MAX_VERTEX_COUNT - 1, MAX_VERTEX_COUNT, MAX_VERTEX_COUNT);
                }
            case ERROR_MESSAGE:
                return MakeString(NULL);
            case MST_LENGTH:
                return MakeInteger((MAX_VERTEX_COUNT - 1) * (MAX_VERTEX_COUNT - 2) / 2 + MAX_VERTEX_COUNT);
            default:
                abort();
        }
    } else {
        abort();
    }
}